

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache(dwarf_resolver *this)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (this->generated_cu_cache == false) {
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:276:40)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:276:40)>
               ::_M_manager;
    local_38._M_unused._M_object = this;
    walk_compilation_units
              (this,(function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    pcVar1 = (this->cu_cache).
             super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (this->cu_cache).
             super__Vector_base<cpptrace::detail::libdwarf::cu_entry,_std::allocator<cpptrace::detail::libdwarf::cu_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar1 != pcVar2) {
      uVar4 = ((long)pcVar2 - (long)pcVar1 >> 3) * -0x3333333333333333;
      lVar3 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::cu_entry*,std::vector<cpptrace::detail::libdwarf::cu_entry,std::allocator<cpptrace::detail::libdwarf::cu_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache()::_lambda(cpptrace::detail::libdwarf::cu_entry_const&,cpptrace::detail::libdwarf::cu_entry_const&)_1_>>
                (pcVar1,pcVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<cpptrace::detail::libdwarf::cu_entry*,std::vector<cpptrace::detail::libdwarf::cu_entry,std::allocator<cpptrace::detail::libdwarf::cu_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<cpptrace::detail::libdwarf::dwarf_resolver::lazy_generate_cu_cache()::_lambda(cpptrace::detail::libdwarf::cu_entry_const&,cpptrace::detail::libdwarf::cu_entry_const&)_1_>>
                (pcVar1,pcVar2);
    }
    this->generated_cu_cache = true;
  }
  return;
}

Assistant:

void lazy_generate_cu_cache() {
            if(!generated_cu_cache) {
                walk_compilation_units([this] (const die_object& cu_die) {
                    Dwarf_Half offset_size = 0;
                    Dwarf_Half dwversion = 0;
                    dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                    if(skeleton) {
                        // NOTE: If we have a corresponding skeleton, we assume we have one CU matching the skeleton CU
                        // Precedence for this assumption is https://dwarfstd.org/doc/DWARF5.pdf#subsection.3.1.3
                        // TODO: Also assuming same dwversion
                        const auto& skeleton_cu = skeleton.unwrap().cu_die;
                        auto ranges_vec = skeleton_cu.get_rangelist_entries(skeleton_cu, dwversion);
                        for(auto range : ranges_vec) {
                            // TODO: Reduce cloning here
                            cu_cache.push_back({ cu_die.clone(), dwversion, range.first, range.second });
                        }
                        return false;
                    } else {
                        auto ranges_vec = cu_die.get_rangelist_entries(cu_die, dwversion);
                        for(auto range : ranges_vec) {
                            // TODO: Reduce cloning here
                            cu_cache.push_back({ cu_die.clone(), dwversion, range.first, range.second });
                        }
                        return true;
                    }
                });
                std::sort(cu_cache.begin(), cu_cache.end(), [] (const cu_entry& a, const cu_entry& b) {
                    return a.low < b.low;
                });
                generated_cu_cache = true;
            }
        }